

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O2

void references::scheme::add_globals(environment *env)

{
  mapped_type *pmVar1;
  allocator local_89;
  key_type local_88;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  pointer pcStack_38;
  pointer local_30;
  code *local_28;
  environment *local_20;
  
  std::__cxx11::string::string((string *)local_68,"nil",(allocator *)&local_88);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_68);
  cell::operator=(pmVar1,(cell *)nil);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string((string *)local_68,"#f",(allocator *)&local_88);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_68);
  cell::operator=(pmVar1,(cell *)false_sym);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string((string *)local_68,"#t",(allocator *)&local_88);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,(key_type *)local_68);
  cell::operator=(pmVar1,(cell *)true_sym);
  std::__cxx11::string::~string((string *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_append;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"append",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_head;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"head",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_tail;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"tail",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_cons;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"cons",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_length;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"length",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_list;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"list",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_nullp;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"null?",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_add;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"+",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_sub;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"-",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_mul;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"*",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_div;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"/",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_greater;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,">",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_less;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"<",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  local_68._0_4_ = Proc;
  local_68._16_8_ = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_28 = proc_less_equal;
  local_20 = (environment *)0x0;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::string((string *)&local_88,"<=",&local_89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
           ::operator[](&env->env_,&local_88);
  cell::operator=(pmVar1,(cell *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  cell::~cell((cell *)local_68);
  return;
}

Assistant:

void add_globals(environment & env)
{
	env["nil"] = nil;   env["#f"] = false_sym;  env["#t"] = true_sym;
	env["append"] = cell(&proc_append);   env["head"] = cell(&proc_head);
	env["tail"] = cell(&proc_tail);      env["cons"] = cell(&proc_cons);
	env["length"] = cell(&proc_length);   env["list"] = cell(&proc_list);
	env["null?"] = cell(&proc_nullp);    env["+"] = cell(&proc_add);
	env["-"] = cell(&proc_sub);      env["*"] = cell(&proc_mul);
	env["/"] = cell(&proc_div);      env[">"] = cell(&proc_greater);
	env["<"] = cell(&proc_less);     env["<="] = cell(&proc_less_equal);
}